

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_MacProjector.cpp
# Opt level: O0

void __thiscall
Hydro::MacProjector::setEBInflowVelocity(MacProjector *this,int amrlev,MultiFab *eb_vel)

{
  bool bVar1;
  BoxArray *pBVar2;
  DistributionMapping *pDVar3;
  unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *i;
  FabArrayBase *in_RDX;
  MultiFab *in_RDI;
  nullptr_t in_stack_ffffffffffffff58;
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  *in_stack_ffffffffffffff60;
  MFInfo *__args_4;
  int *in_stack_ffffffffffffff98;
  DistributionMapping *in_stack_ffffffffffffffa0;
  BoxArray *__args;
  pointer __args_5;
  
  amrex::
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::operator[](in_stack_ffffffffffffff60,(size_type)in_stack_ffffffffffffff58);
  bVar1 = std::operator==((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                          in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  if (bVar1) {
    pBVar2 = amrex::FabArrayBase::boxArray(in_RDX);
    pDVar3 = amrex::FabArrayBase::DistributionMap(in_RDX);
    amrex::FabArrayBase::nComp(in_RDX);
    amrex::FabArrayBase::nGrow(in_RDX,0);
    __args_5 = (pointer)0x0;
    __args = (BoxArray *)0x0;
    __args_4 = (MFInfo *)&stack0xffffffffffffffa8;
    amrex::MFInfo::MFInfo((MFInfo *)0x9ec694);
    i = (unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
        amrex::FabArray<amrex::FArrayBox>::Factory((FabArray<amrex::FArrayBox> *)0x9ec6a1);
    std::
    make_unique<amrex::MultiFab,amrex::BoxArray_const&,amrex::DistributionMapping_const&,int,int,amrex::MFInfo,amrex::FabFactory<amrex::FArrayBox>const&>
              (__args,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(int *)in_RDI,__args_4,
               (FabFactory<amrex::FArrayBox> *)__args_5);
    amrex::
    Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ::operator[](in_stack_ffffffffffffff60,(size_type)i);
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator=
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
               in_stack_ffffffffffffff60,i);
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::~unique_ptr
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
               in_stack_ffffffffffffff60);
    amrex::MFInfo::~MFInfo((MFInfo *)0x9ec715);
    amrex::
    Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ::operator[](in_stack_ffffffffffffff60,(size_type)i);
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator*
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
               in_stack_ffffffffffffff60);
    amrex::FabArrayBase::nComp(in_RDX);
    amrex::FabArrayBase::nGrow(in_RDX,0);
    amrex::MultiFab::Copy
              (in_RDI,(MultiFab *)__args_4,(int)((ulong)pDVar3 >> 0x20),(int)pDVar3,
               (int)((ulong)pBVar2 >> 0x20),(int)pBVar2);
  }
  return;
}

Assistant:

void MacProjector::setEBInflowVelocity (int amrlev, const MultiFab& eb_vel)
{

    if (m_eb_vel[amrlev] == nullptr) {
      m_eb_vel[amrlev] = std::make_unique<MultiFab>(eb_vel.boxArray(),
            eb_vel.DistributionMap(), eb_vel.nComp(), eb_vel.nGrow(), MFInfo(), eb_vel.Factory());
      MultiFab::Copy(*m_eb_vel[amrlev], eb_vel, 0, 0, eb_vel.nComp(), eb_vel.nGrow());
    }
}